

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O1

void webrtc::ScaleErrorSignal(float mu,float error_threshold,float *x_pow,float (*ef) [65])

{
  long lVar1;
  float fVar2;
  float fVar3;
  
  lVar1 = 0;
  do {
    fVar2 = (*ef)[lVar1] / (x_pow[lVar1] + 1e-10);
    (*ef)[lVar1] = fVar2;
    fVar3 = ef[1][lVar1] / (x_pow[lVar1] + 1e-10);
    ef[1][lVar1] = fVar3;
    fVar2 = fVar2 * fVar2 + fVar3 * fVar3;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    if (error_threshold < fVar2) {
      fVar2 = error_threshold / (fVar2 + 1e-10);
      (*ef)[lVar1] = (*ef)[lVar1] * fVar2;
      ef[1][lVar1] = fVar2 * ef[1][lVar1];
    }
    (*ef)[lVar1] = (*ef)[lVar1] * mu;
    ef[1][lVar1] = ef[1][lVar1] * mu;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x41);
  return;
}

Assistant:

static void ScaleErrorSignal(float mu,
                             float error_threshold,
                             float x_pow[PART_LEN1],
                             float ef[2][PART_LEN1]) {
  int i;
  float abs_ef;
  for (i = 0; i < (PART_LEN1); i++) {
    ef[0][i] /= (x_pow[i] + 1e-10f);
    ef[1][i] /= (x_pow[i] + 1e-10f);
    abs_ef = sqrtf(ef[0][i] * ef[0][i] + ef[1][i] * ef[1][i]);

    if (abs_ef > error_threshold) {
      abs_ef = error_threshold / (abs_ef + 1e-10f);
      ef[0][i] *= abs_ef;
      ef[1][i] *= abs_ef;
    }

    // Stepsize factor
    ef[0][i] *= mu;
    ef[1][i] *= mu;
  }
}